

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O0

void cf2_hintmap_init(CF2_HintMap hintmap,CF2_Font font,CF2_HintMap initialMap,
                     CF2_ArrStack hintMoves,CF2_F16Dot16 scale)

{
  CF2_F16Dot16 scale_local;
  CF2_ArrStack hintMoves_local;
  CF2_HintMap initialMap_local;
  CF2_Font font_local;
  CF2_HintMap hintmap_local;
  
  memset(hintmap,0,0x1828);
  hintmap->hinted = font->hinted;
  hintmap->scale = scale;
  hintmap->font = font;
  hintmap->initialHintMap = initialMap;
  hintmap->hintMoves = hintMoves;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_hintmap_init( CF2_HintMap   hintmap,
                    CF2_Font      font,
                    CF2_HintMap   initialMap,
                    CF2_ArrStack  hintMoves,
                    CF2_Fixed     scale )
  {
    FT_ZERO( hintmap );

    /* copy parameters from font instance */
    hintmap->hinted         = font->hinted;
    hintmap->scale          = scale;
    hintmap->font           = font;
    hintmap->initialHintMap = initialMap;
    /* will clear in `cf2_hintmap_adjustHints' */
    hintmap->hintMoves      = hintMoves;
  }